

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O1

bool midi_processor::process_riff_midi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar12;
  int *piVar13;
  int *piVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  string field;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  midi_meta_data meta_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  int *local_f8;
  char *local_f0;
  char *local_e8;
  char local_e0;
  undefined7 uStack_df;
  midi_container *local_d0;
  midi_meta_data_item local_c8;
  char *local_80;
  char *local_78;
  ulong local_70;
  midi_meta_data local_68;
  ulong uVar11;
  
  puVar3 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar13 = (int *)(puVar3 + (ulong)*(uint *)(puVar3 + 4) + 8);
  piVar14 = (int *)(puVar3 + 0xc);
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar9 = false;
  bVar8 = false;
  local_d0 = p_out;
  do {
    if (piVar14 == piVar13) goto LAB_00110f85;
    if ((long)piVar13 - (long)piVar14 < 8) goto LAB_00110f9b;
    bVar1 = *(byte *)(piVar14 + 1);
    uVar10 = (uint)*(byte *)((long)piVar14 + 7) << 0x18 |
             (uint)*(byte *)((long)piVar14 + 6) << 0x10 | (uint)*(byte *)((long)piVar14 + 5) << 8 |
             (uint)bVar1;
    uVar11 = (ulong)uVar10;
    iVar12 = 1;
    if ((ulong)((long)piVar13 - (long)piVar14) < uVar11) goto LAB_00110d50;
    if ((char)*piVar14 == 'd') {
      uVar4 = 0;
      do {
        uVar7 = uVar4;
        if (uVar7 == 3) break;
        uVar4 = uVar7 + 1;
      } while ((uint)*(byte *)((long)piVar14 + uVar7 + 1) == (int)"data"[uVar7 + 1]);
      if (uVar7 < 3) goto LAB_00110b92;
      if (!bVar8) {
        local_c8.m_timestamp = 0;
        local_c8.m_name._M_dataplus._M_p = (pointer)0x0;
        local_c8.m_name._M_string_length = 0;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,piVar14 + 2,
                   (char *)((long)piVar14 + uVar11 + 8));
        bVar5 = process_standard_midi
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
                           local_d0);
        if (bVar5) {
          bVar8 = true;
        }
        if ((void *)local_c8.m_timestamp != (void *)0x0) {
          operator_delete((void *)local_c8.m_timestamp,
                          local_c8.m_name._M_string_length - local_c8.m_timestamp);
        }
        if (!bVar5) goto LAB_00110d50;
        piVar14 = (int *)((long)piVar14 + (ulong)(uVar10 + 8));
        piVar14 = (int *)((long)piVar14 + (ulong)(piVar14 != piVar13 & bVar1));
        goto LAB_00110d3a;
      }
    }
    else {
LAB_00110b92:
      if ((char)*piVar14 == 'D') {
        uVar4 = 0;
        do {
          uVar7 = uVar4;
          if (uVar7 == 3) break;
          uVar4 = uVar7 + 1;
        } while ((uint)*(byte *)((long)piVar14 + uVar7 + 1) == (int)"DISP"[uVar7 + 1]);
        if (uVar7 < 3) goto LAB_00110c98;
        if (piVar14[2] == 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_118,(ulong)(uVar10 - 3));
          if (uVar10 != 4) {
            memmove(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,piVar14 + 3,uVar11 - 4);
          }
          local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10 - 4] = '\0';
          midi_meta_data_item::midi_meta_data_item
                    (&local_c8,0,"display_name",
                     (char *)local_118.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          midi_meta_data::add_item(&local_68,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.m_value._M_dataplus._M_p != &local_c8.m_value.field_2) {
            operator_delete(local_c8.m_value._M_dataplus._M_p,
                            local_c8.m_value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.m_name._M_dataplus._M_p != &local_c8.m_name.field_2) {
            operator_delete(local_c8.m_name._M_dataplus._M_p,
                            local_c8.m_name.field_2._M_allocated_capacity + 1);
          }
        }
        uVar11 = (ulong)(uVar10 + 8);
      }
      else {
LAB_00110c98:
        if ((char)*piVar14 == 'L') {
          uVar4 = 0;
          do {
            uVar7 = uVar4;
            if (uVar7 == 3) break;
            uVar4 = uVar7 + 1;
          } while ((uint)*(byte *)((long)piVar14 + uVar7 + 1) == (int)"LIST"[uVar7 + 1]);
          if (2 < uVar7) {
            if ((char)piVar14[2] == 'I') {
              local_f8 = (int *)((long)piVar14 + uVar11 + 8);
              uVar4 = 0;
              do {
                uVar7 = uVar4;
                if (uVar7 == 3) break;
                uVar4 = uVar7 + 1;
              } while ((uint)*(byte *)((long)piVar14 + uVar7 + 9) == (int)"INFO"[uVar7 + 1]);
              if (uVar7 < 3) {
                bVar5 = false;
              }
              else {
                if ((bVar9) || (uVar10 < 4)) goto LAB_00110d24;
                if (uVar11 != 4) {
                  piVar14 = piVar14 + 3;
                  do {
                    if ((long)local_f8 - (long)piVar14 < 4) goto LAB_00110d24;
                    bVar2 = *(byte *)(piVar14 + 1);
                    uVar10 = (uint)*(byte *)((long)piVar14 + 7) << 0x18 |
                             (uint)*(byte *)((long)piVar14 + 6) << 0x10 |
                             (uint)*(byte *)((long)piVar14 + 5) << 8;
                    local_70 = (ulong)(bVar2 + uVar10 + 8);
                    if ((ulong)((long)local_f8 - (long)piVar14) < local_70) {
                      bVar5 = false;
                      goto LAB_00110d7a;
                    }
                    local_f0 = &local_e0;
                    local_e8 = (char *)0x0;
                    local_e0 = '\0';
                    std::__cxx11::string::
                    _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((string *)&local_f0,local_f0,local_f0,piVar14,piVar14 + 1);
                    uVar10 = uVar10 | bVar2;
                    lVar6 = 8;
                    do {
                      if (*piVar14 ==
                          **(int **)((long)&__do_global_dtors_aux_fini_array_entry + lVar6)) {
                        local_80 = *(char **)((long)riff_tag_mappings[0] + lVar6);
                        local_78 = local_e8;
                        strlen(local_80);
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_f0,0,local_78,(ulong)local_80);
                        break;
                      }
                      lVar6 = lVar6 + 0x10;
                    } while (lVar6 != 0x148);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_118,(ulong)(uVar10 + 1));
                    if (uVar10 != 0) {
                      memmove(local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,piVar14 + 2,(ulong)uVar10);
                    }
                    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10] = '\0';
                    midi_meta_data_item::midi_meta_data_item
                              (&local_c8,0,local_f0,
                               (char *)local_118.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                    midi_meta_data::add_item(&local_68,&local_c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8.m_value._M_dataplus._M_p != &local_c8.m_value.field_2) {
                      operator_delete(local_c8.m_value._M_dataplus._M_p,
                                      local_c8.m_value.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8.m_name._M_dataplus._M_p != &local_c8.m_name.field_2) {
                      operator_delete(local_c8.m_name._M_dataplus._M_p,
                                      local_c8.m_name.field_2._M_allocated_capacity + 1);
                    }
                    piVar14 = (int *)((long)piVar14 + local_70);
                    bVar5 = piVar14 != local_f8;
                    if (local_f0 != &local_e0) {
                      operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
                    }
                    piVar14 = (int *)((long)piVar14 + (ulong)(bVar2 & bVar5));
                  } while (piVar14 != local_f8);
                }
                piVar14 = (int *)((ulong)(local_f8 != piVar13 & bVar1) + (long)local_f8);
                bVar5 = true;
                bVar9 = true;
              }
            }
            else {
LAB_00110d24:
              bVar5 = false;
            }
LAB_00110d7a:
            if (bVar5) goto LAB_00110d3a;
            goto LAB_00110d50;
          }
        }
      }
      piVar14 = (int *)((long)((long)piVar14 + uVar11) +
                       (ulong)((int *)((long)piVar14 + uVar11) != piVar13 & bVar1));
LAB_00110d3a:
      if ((!bVar8) || (iVar12 = 3, !bVar9)) {
        iVar12 = 0;
      }
    }
LAB_00110d50:
  } while (iVar12 == 0);
  if (iVar12 == 3) {
LAB_00110f85:
    bVar8 = true;
    midi_container::set_extra_meta_data(local_d0,&local_68);
  }
  else {
LAB_00110f9b:
    bVar8 = false;
  }
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.m_bitmap.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.m_bitmap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.m_bitmap.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::~vector(&local_68.m_data);
  return bVar8;
}

Assistant:

bool midi_processor::process_riff_midi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    bool found_data = false;
    bool found_info = false;

    midi_meta_data meta_data;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = toInt32LE( it + 4 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal( it, "data", 4 ) )
        {
            if ( !found_data )
            {
                std::vector<uint8_t> midi_file;
                midi_file.assign( it + 8, it + 8 + chunk_size );
                if ( !process_standard_midi( midi_file, p_out ) ) return false;
                found_data = true;
            }
            else return false; /*throw exception_io_data( "Multiple RIFF data chunks found" );*/
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "DISP", 4 ) )
        {
            uint32_t type = toInt32LE( it + 8 );
            if ( type == 1 )
            {
                extra_buffer.resize( chunk_size - 4 + 1 );
                std::copy( it + 12, it + 8 + chunk_size, extra_buffer.begin() );
				extra_buffer[ chunk_size - 4 ] = '\0';
                meta_data.add_item( midi_meta_data_item( 0, "display_name", (const char *) &extra_buffer[0] ) );
            }
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "LIST", 4 ) )
        {
            std::vector<uint8_t>::const_iterator chunk_end = it + 8 + chunk_size;
            if ( it_equal( it + 8, "INFO", 4 ) )
            {
                if ( !found_info )
                {
                    if ( chunk_end - it < 12 ) return false;
                    it += 12;
                    while ( it != chunk_end )
                    {
                        if ( chunk_end - it < 4 ) return false;
                        uint32_t field_size = toInt32LE( it + 4 );
                        if ( (unsigned long)(chunk_end - it) < 8 + field_size ) return false;
                        std::string field;
                        field.assign( it, it + 4 );
                        for ( unsigned i = 0; i < _countof(riff_tag_mappings); ++i )
                        {
                            if ( !memcmp( &it[0], riff_tag_mappings[ i ][ 0 ], 4 ) )
                            {
                                field = riff_tag_mappings[ i ][ 1 ];
                                break;
                            }
                        }
                        extra_buffer.resize( field_size + 1 );
                        std::copy( it + 8, it + 8 + field_size, extra_buffer.begin() );
						extra_buffer[ field_size ] = '\0';
                        it += 8 + field_size;
                        meta_data.add_item( midi_meta_data_item( 0, field.c_str(), ( const char * ) &extra_buffer[0] ) );
                        if ( field_size & 1 && it != chunk_end ) ++it;
                    }
                    found_info = true;
                }
                else return false; /*throw exception_io_data( "Multiple RIFF LIST INFO chunks found" );*/
            }
            else return false; /* unknown LIST chunk */
            it = chunk_end;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }

        if ( found_data && found_info ) break;
    }

    p_out.set_extra_meta_data( meta_data );

    return true;
}